

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_graph_print(ggml_cgraph *cgraph)

{
  ggml_op gVar1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int i;
  ulong uVar4;
  long lVar5;
  int i_1;
  double dVar6;
  double dVar7;
  double dVar8;
  int64_t perf_total_per_op_us [35];
  
  memset(perf_total_per_op_us,0,0x118);
  puts("=== GRAPH ===");
  printf("n_nodes = %d\n",(ulong)(uint)cgraph->n_nodes);
  for (uVar4 = 0; (long)uVar4 < (long)cgraph->n_nodes; uVar4 = uVar4 + 1) {
    pgVar2 = cgraph->nodes[uVar4];
    lVar5 = pgVar2->perf_time_us;
    gVar1 = pgVar2->op;
    perf_total_per_op_us[gVar1] = perf_total_per_op_us[gVar1] + lVar5;
    pcVar3 = "x";
    if ((pgVar2->is_param == false) && (pcVar3 = "g", pgVar2->grad == (ggml_tensor *)0x0)) {
      pcVar3 = " ";
    }
    dVar6 = (double)pgVar2->perf_cycles / 1000.0;
    dVar8 = (double)pgVar2->perf_runs;
    dVar7 = (double)lVar5 / 1000.0;
    printf(" - %3d: [ %6d, %6d, %6d] %16s %s (%3d) cpu = %7.3f / %7.3f ms, wall = %7.3f / %7.3f ms\n"
           ,dVar6,dVar6 / dVar8,dVar7,dVar7 / dVar8,uVar4 & 0xffffffff,(ulong)(uint)pgVar2->ne[0],
           (ulong)(uint)pgVar2->ne[1],(ulong)(uint)pgVar2->ne[2],GGML_OP_LABEL[gVar1],pcVar3,
           (ulong)(uint)pgVar2->perf_runs);
  }
  printf("n_leafs = %d\n",(ulong)(uint)cgraph->n_leafs);
  for (uVar4 = 0; (long)uVar4 < (long)cgraph->n_leafs; uVar4 = uVar4 + 1) {
    pgVar2 = cgraph->leafs[uVar4];
    printf(" - %3d: [ %6d, %6d] %8s\n",uVar4 & 0xffffffff,(ulong)(uint)pgVar2->ne[0],
           (ulong)(uint)pgVar2->ne[1],GGML_OP_LABEL[pgVar2->op]);
  }
  for (lVar5 = 0; lVar5 != 0x118; lVar5 = lVar5 + 8) {
    printf("perf_total_per_op_us[%16s] = %7.3f ms\n",
           (double)*(long *)((long)perf_total_per_op_us + lVar5) / 1000.0,
           *(undefined8 *)((long)GGML_OP_LABEL + lVar5));
  }
  puts("========================================");
  return;
}

Assistant:

void ggml_graph_print(const struct ggml_cgraph * cgraph) {
    int64_t perf_total_per_op_us[GGML_OP_COUNT] = {0};

    GGML_PRINT("=== GRAPH ===\n");

    GGML_PRINT_DEBUG("n_threads       = %d\n",       cgraph->n_threads);
    GGML_PRINT_DEBUG("total work size = %zu bytes\n",cgraph->work_size);

    GGML_PRINT("n_nodes = %d\n", cgraph->n_nodes);
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        perf_total_per_op_us[node->op] += node->perf_time_us;

        GGML_PRINT(" - %3d: [ %6d, %6d, %6d] %16s %s (%3d) cpu = %7.3f / %7.3f ms, wall = %7.3f / %7.3f ms\n",
                i,
                node->ne[0], node->ne[1], node->ne[2],
                GGML_OP_LABEL[node->op], node->is_param ? "x" : node->grad ? "g" : " ", node->perf_runs,
                (double) node->perf_cycles  / (double) ggml_cycles_per_ms(),
                (double) node->perf_cycles  / (double) ggml_cycles_per_ms() / (double) node->perf_runs,
                (double) node->perf_time_us / 1000.0,
                (double) node->perf_time_us / 1000.0 / node->perf_runs);
    }

    GGML_PRINT("n_leafs = %d\n", cgraph->n_leafs);
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * node = cgraph->leafs[i];

        GGML_PRINT(" - %3d: [ %6d, %6d] %8s\n",
                i,
                node->ne[0], node->ne[1],
                GGML_OP_LABEL[node->op]);
    }

    for (int i = 0; i < GGML_OP_COUNT; i++) {
        GGML_PRINT("perf_total_per_op_us[%16s] = %7.3f ms\n", GGML_OP_LABEL[i], (double) perf_total_per_op_us[i] / 1000.0);
    }

    GGML_PRINT("========================================\n");
}